

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLUri::XMLUri(XMLUri *this,XMLUri *baseURI,XMLCh *uriSpec,MemoryManager *manager)

{
  OutOfMemoryException *anon_var_0;
  undefined1 local_50 [8];
  CleanupType_conflict5 cleanup;
  MemoryManager *manager_local;
  XMLCh *uriSpec_local;
  XMLUri *baseURI_local;
  XMLUri *this_local;
  
  XSerializable::XSerializable(&this->super_XSerializable);
  XMemory::XMemory((XMemory *)this);
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLUri_00526bf8;
  this->fPort = -1;
  this->fScheme = (XMLCh *)0x0;
  this->fUserInfo = (XMLCh *)0x0;
  this->fHost = (XMLCh *)0x0;
  this->fRegAuth = (XMLCh *)0x0;
  this->fPath = (XMLCh *)0x0;
  this->fQueryString = (XMLCh *)0x0;
  this->fFragment = (XMLCh *)0x0;
  this->fURIText = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  JanitorMemFunCall<xercesc_4_0::XMLUri>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLUri> *)local_50,this,(MFPT)cleanUp);
  initialize(this,baseURI,uriSpec);
  JanitorMemFunCall<xercesc_4_0::XMLUri>::release
            ((JanitorMemFunCall<xercesc_4_0::XMLUri> *)local_50);
  JanitorMemFunCall<xercesc_4_0::XMLUri>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLUri> *)local_50);
  return;
}

Assistant:

XMLUri::XMLUri(const XMLUri* const      baseURI
              , const XMLCh* const   uriSpec
              , MemoryManager* const manager)
: fPort(-1)
, fScheme(0)
, fUserInfo(0)
, fHost(0)
, fRegAuth(0)
, fPath(0)
, fQueryString(0)
, fFragment(0)
, fURIText(0)
, fMemoryManager(manager)
{
    CleanupType cleanup(this, &XMLUri::cleanUp);

    try {
        initialize(baseURI, uriSpec);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}